

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O0

string * __thiscall wasm::Type::toString_abi_cxx11_(string *__return_storage_ptr__,Type *this)

{
  Type *this_local;
  
  genericToString<wasm::Type>(__return_storage_ptr__,this);
  return __return_storage_ptr__;
}

Assistant:

std::string Type::toString() const { return genericToString(*this); }